

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O1

UBool __thiscall icu_63::RuleBasedTimeZone::useDaylightTime(RuleBasedTimeZone *this)

{
  UBool UVar1;
  int32_t iVar2;
  UDate UVar3;
  TimeZoneRule *to;
  int32_t dst;
  int32_t raw;
  UErrorCode status;
  TimeZoneRule *from;
  UDate time;
  TimeZoneRule *local_40;
  int local_34;
  undefined1 local_30 [4];
  undefined4 local_2c;
  TimeZoneRule *local_28;
  UDate local_20;
  
  local_2c = 0;
  UVar3 = uprv_getUTCtime_63();
  (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[6])
            (this,0,local_30,&local_34,&local_2c);
  UVar1 = '\x01';
  if (local_34 == 0) {
    UVar1 = findNext(this,UVar3 * 1000.0,'\0',&local_20,&local_28,&local_40);
    if ((UVar1 != '\0') && (iVar2 = TimeZoneRule::getDSTSavings(local_40), iVar2 != 0)) {
      return '\x01';
    }
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

UBool
RuleBasedTimeZone::useDaylightTime(void) const {
    // Note: This implementation returns true when
    // daylight saving time is used as of now or
    // after the next transition.
    UErrorCode status = U_ZERO_ERROR;
    UDate now = uprv_getUTCtime() * U_MILLIS_PER_SECOND;
    int32_t raw, dst;
    getOffset(now, FALSE, raw, dst, status);
    if (dst != 0) {
        return TRUE;
    }
    // If DST is not used now, check if DST is used after the next transition
    UDate time;
    TimeZoneRule *from, *to;
    UBool avail = findNext(now, FALSE, time, from, to);
    if (avail && to->getDSTSavings() != 0) {
        return TRUE;
    }
    return FALSE;
}